

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onExitDeclareStatementAstNode
          (SemanticAnalyzerRun *this,DeclareStatementAstNode *node)

{
  Scope *this_00;
  element_type *variableName;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  variableName = (node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&(node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
  Scope::define(this_00,&variableName->value,(shared_ptr<Token> *)&local_30,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    this->currentScope->define(node->identifier->value, node->identifier, true);
  }